

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::WeakDescriptorDataSection_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view prefix,Descriptor *descriptor,
          int index_in_file_messages,Options *options)

{
  char *buffer;
  long lVar1;
  size_t *psVar2;
  Nonnull<char_*> pcVar3;
  undefined4 in_register_0000008c;
  AlphaNum *d;
  string_view name;
  string_view filename;
  Options *in_stack_fffffffffffffee8;
  string local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  undefined8 local_60;
  char *local_58;
  
  d = (AlphaNum *)CONCAT44(in_register_0000008c,index_in_file_messages);
  local_90.piece_._M_str = (char *)prefix._M_len;
  lVar1 = *(long *)(prefix._M_str + 0x18);
  local_60 = 3;
  local_58 = "pb_";
  local_c0.piece_._M_len = 1;
  local_c0.piece_._M_str = "_";
  buffer = local_f0.digits_;
  local_90.piece_._M_len = (size_t)this;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer((int32_t)descriptor,buffer);
  local_f0.piece_._M_len = (long)pcVar3 - (long)buffer;
  local_f0.piece_._M_str = buffer;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_110,(lts_20250127 *)&local_60,&local_90,&local_c0,&local_f0,d);
  psVar2 = *(size_t **)(lVar1 + 8);
  name._M_str = (char *)psVar2[1];
  name._M_len = (size_t)local_110._M_dataplus._M_p;
  filename._M_str = (char *)d;
  filename._M_len = *psVar2;
  UniqueName_abi_cxx11_
            (__return_storage_ptr__,(cpp *)local_110._M_string_length,name,filename,
             in_stack_fffffffffffffee8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WeakDescriptorDataSection(absl::string_view prefix,
                                      const Descriptor* descriptor,
                                      int index_in_file_messages,
                                      const Options& options) {
  const auto* file = descriptor->file();

  // To make a compact name we use the index of the object in its file
  // of its name.
  // So the name could be `pb_def_3_HASH` instead of
  // `pd_def_VeryLongClassName_WithNesting_AndMoreNames_HASH`
  // We need a know common prefix to merge the sections later on.
  return UniqueName(absl::StrCat("pb_", prefix, "_", index_in_file_messages),
                    file, options);
}